

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

Signature __thiscall
wasm::WasmBinaryBuilder::getSignatureByFunctionIndex(WasmBinaryBuilder *this,Index index)

{
  bool bVar1;
  Signature SVar2;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  HeapType local_20;
  HeapType heapType;
  
  local_20 = getTypeByFunctionIndex(this,index);
  bVar1 = HeapType::isSignature(&local_20);
  if (bVar1) {
    SVar2 = HeapType::getSignature(&local_20);
    return SVar2;
  }
  HeapType::toString_abi_cxx11_(&local_60,&local_20);
  std::operator+(&local_40,"invalid signature type ",&local_60);
  throwError(this,&local_40);
}

Assistant:

Signature WasmBinaryBuilder::getSignatureByFunctionIndex(Index index) {
  auto heapType = getTypeByFunctionIndex(index);
  if (!heapType.isSignature()) {
    throwError("invalid signature type " + heapType.toString());
  }
  return heapType.getSignature();
}